

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

mat4 * mat4_normal_transform(mat4 m)

{
  mat4 *in_RDI;
  mat4 in_stack_00000210;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  
  mat4_inverse(in_stack_00000210);
  in_RDI->m[0] = local_50;
  in_RDI->m[1] = local_40;
  in_RDI->m[2] = local_30;
  in_RDI->m[3] = local_20;
  in_RDI->m[4] = local_4c;
  in_RDI->m[5] = local_3c;
  in_RDI->m[6] = local_2c;
  in_RDI->m[7] = local_1c;
  in_RDI->m[8] = local_48;
  in_RDI->m[9] = local_38;
  in_RDI->m[10] = local_28;
  in_RDI->m[0xb] = local_18;
  in_RDI->m[0xc] = local_44;
  in_RDI->m[0xd] = local_34;
  in_RDI->m[0xe] = local_24;
  in_RDI->m[0xf] = local_14;
  return in_RDI;
}

Assistant:

mat4 mat4_normal_transform(mat4 m) {
    return mat4_transpose(mat4_inverse(m));
}